

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v)

{
  size_type sVar1;
  const_reference v_00;
  ulong local_20;
  size_t i;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  local_20 = 0;
  while( true ) {
    sVar1 = tinyusdz::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)v);
    if (sVar1 <= local_20) break;
    v_00 = vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator[](v,local_20);
    operator<<(os,v_00);
    sVar1 = tinyusdz::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::size
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)v);
    if (local_20 != sVar1 - 1) {
      std::operator<<(os,", ");
    }
    local_20 = local_20 + 1;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}